

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUVProcessChain.cxx
# Opt level: O2

bool testUVProcessChainExternalLoop(char *helperCommand)

{
  bool bVar1;
  int fd;
  cmUVProcessChainBuilder *pcVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  ostream *poVar5;
  long lVar6;
  char *pcVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  cmUVProcessChain chain;
  allocator_type local_24a;
  allocator<char> local_249;
  uv_loop_ptr loop;
  string output;
  cmUVProcessChainBuilder builder;
  cmUVPipeIStream stream;
  
  loop.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  loop.loop.super___shared_ptr<uv_loop_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cm::uv_loop_ptr::init(&loop,(EVP_PKEY_CTX *)0x0);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&builder);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stream,helperCommand,(allocator<char> *)&chain);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &stream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>.field_0x20,"echo",&local_249);
  __l._M_len = 2;
  __l._M_array = (iterator)&stream;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&output,__l,&local_24a);
  pcVar2 = cmUVProcessChainBuilder::AddCommand
                     (&builder,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&output);
  pcVar2 = cmUVProcessChainBuilder::SetBuiltinStream(pcVar2,Stream_OUTPUT);
  puVar3 = cm::uv_loop_ptr::operator*(&loop);
  cmUVProcessChainBuilder::SetExternalLoop(pcVar2,puVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&output);
  lVar6 = 0x20;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&stream.super_cmBasicUVIStream<char,_std::char_traits<char>_>.
                       super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream +
               lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  puVar3 = cmUVProcessChainBuilder::GetLoop(&builder);
  puVar4 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&loop);
  if (puVar3 != puVar4) {
    poVar5 = std::operator<<((ostream *)&std::cout,"GetLoop() should return external loop");
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
    goto LAB_001be2fb;
  }
  cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)&chain);
  puVar3 = cmUVProcessChain::GetLoop(&chain);
  puVar4 = cm::uv_loop_ptr::operator_cast_to_uv_loop_s_(&loop);
  if (puVar3 == puVar4) {
    bVar1 = cmUVProcessChain::Wait(&chain,0);
    if (!bVar1) {
      pcVar7 = "Wait() timed out";
      goto LAB_001be2dd;
    }
    puVar3 = cmUVProcessChain::GetLoop(&chain);
    fd = cmUVProcessChain::OutputStream(&chain);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream(&stream,puVar3,fd);
    getInput_abi_cxx11_(&output,(istream *)&stream);
    bVar1 = std::operator!=(&output,"HELLO world!");
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Output was \"");
      poVar5 = std::operator<<(poVar5,(string *)&output);
      poVar5 = std::operator<<(poVar5,"\", expected \"HELLO world!\"");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    bVar1 = !bVar1;
    std::__cxx11::string::~string((string *)&output);
    cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream(&stream);
  }
  else {
    pcVar7 = "GetLoop() should return external loop";
LAB_001be2dd:
    poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar5);
    bVar1 = false;
  }
  cmUVProcessChain::~cmUVProcessChain(&chain);
LAB_001be2fb:
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder(&builder);
  cm::uv_loop_ptr::~uv_loop_ptr(&loop);
  return bVar1;
}

Assistant:

bool testUVProcessChainExternalLoop(const char* helperCommand)
{
  cm::uv_loop_ptr loop;
  loop.init();

  cmUVProcessChainBuilder builder;
  builder.AddCommand({ helperCommand, "echo" })
    .SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .SetExternalLoop(*loop);
  if (builder.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  auto chain = builder.Start();

  if (&chain.GetLoop() != loop) {
    std::cout << "GetLoop() should return external loop" << std::endl;
    return false;
  }

  if (!chain.Wait()) {
    std::cout << "Wait() timed out" << std::endl;
    return false;
  }

  cmUVPipeIStream stream(chain.GetLoop(), chain.OutputStream());
  std::string output = getInput(stream);
  if (output != "HELLO world!") {
    std::cout << "Output was \"" << output << "\", expected \"HELLO world!\""
              << std::endl;
    return false;
  }

  return true;
}